

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Omega_h_class.cpp
# Opt level: O0

void Omega_h::classify_by_angles(Mesh *mesh,Real sharp_angle)

{
  Omega_h_Family OVar1;
  int low_dim;
  LO size_in;
  int high_dim;
  bool bVar2;
  Write<signed_char> local_200;
  Read<signed_char> local_1f0;
  Read<signed_char> local_1e0;
  undefined1 local_1d0 [8];
  type f;
  string local_190 [32];
  undefined1 local_170 [8];
  Write<signed_char> hinge_is_sharp;
  undefined1 local_158 [4];
  LO nhinges;
  Read<int> local_148;
  Read<double> local_138;
  undefined1 local_128 [8];
  Reals surf_hinge_angles;
  undefined1 local_108 [8];
  LOs side2surf_side;
  LO nsides;
  LO nsurf_hinges;
  undefined1 local_e0 [8];
  LOs surf_hinge2hinge;
  undefined1 local_c0 [8];
  Reals surf_side_normals;
  undefined1 local_a0 [8];
  LOs surf_side2side;
  undefined1 local_80 [8];
  Read<signed_char> hinge_is_exposed;
  Read<signed_char> local_60;
  undefined1 local_50 [8];
  Read<signed_char> side_is_exposed;
  Int dim;
  Real sharp_angle_local;
  Mesh *mesh_local;
  ulong local_10;
  
  OVar1 = Mesh::family(mesh);
  if (OVar1 != OMEGA_H_SIMPLEX) {
    fail("assertion %s failed at %s +%d\n","mesh->family() == OMEGA_H_SIMPLEX",
         "/workspace/llm4binary/github/license_all_cmakelists_25/gahansen[P]omega_h/src/Omega_h_class.cpp"
         ,0x2b);
  }
  side_is_exposed.write_.shared_alloc_.direct_ptr._4_4_ = Mesh::dim(mesh);
  classify_elements(mesh);
  mark_exposed_sides((Omega_h *)local_50,mesh);
  Read<signed_char>::Read(&local_60,(Read<signed_char> *)local_50);
  classify_sides_by_exposure(mesh,&local_60);
  Read<signed_char>::~Read(&local_60);
  if (side_is_exposed.write_.shared_alloc_.direct_ptr._4_4_ == 1) {
    hinge_is_exposed.write_.shared_alloc_.direct_ptr._0_4_ = 1;
  }
  else {
    high_dim = side_is_exposed.write_.shared_alloc_.direct_ptr._4_4_ + -1;
    low_dim = side_is_exposed.write_.shared_alloc_.direct_ptr._4_4_ + -2;
    Read<signed_char>::Read
              ((Read<signed_char> *)&surf_side2side.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)local_50);
    mark_down((Omega_h *)local_80,mesh,high_dim,low_dim,
              (Read<signed_char> *)&surf_side2side.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read((Read<signed_char> *)&surf_side2side.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read
              ((Read<signed_char> *)&surf_side_normals.write_.shared_alloc_.direct_ptr,
               (Read<signed_char> *)local_50);
    collect_marked((Omega_h *)local_a0,
                   (Read<signed_char> *)&surf_side_normals.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::~Read
              ((Read<signed_char> *)&surf_side_normals.write_.shared_alloc_.direct_ptr);
    Read<int>::Read((Read<int> *)&surf_hinge2hinge.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)local_a0);
    get_side_vectors((Omega_h *)local_c0,mesh,
                     (LOs *)&surf_hinge2hinge.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&surf_hinge2hinge.write_.shared_alloc_.direct_ptr);
    Read<signed_char>::Read((Read<signed_char> *)&nsides,(Read<signed_char> *)local_80);
    collect_marked((Omega_h *)local_e0,(Read<signed_char> *)&nsides);
    Read<signed_char>::~Read((Read<signed_char> *)&nsides);
    if (((ulong)local_e0 & 1) == 0) {
      local_10 = *(size_t *)local_e0;
    }
    else {
      local_10 = (ulong)local_e0 >> 3;
    }
    side2surf_side.write_.shared_alloc_.direct_ptr._4_4_ = (LO)(local_10 >> 2);
    side2surf_side.write_.shared_alloc_.direct_ptr._0_4_ =
         Mesh::nents(mesh,side_is_exposed.write_.shared_alloc_.direct_ptr._4_4_ + -1);
    Read<int>::Read((Read<int> *)&surf_hinge_angles.write_.shared_alloc_.direct_ptr,
                    (Read<int> *)local_a0);
    invert_injective_map
              ((Omega_h *)local_108,(LOs *)&surf_hinge_angles.write_.shared_alloc_.direct_ptr,
               (LO)side2surf_side.write_.shared_alloc_.direct_ptr);
    Read<int>::~Read((Read<int> *)&surf_hinge_angles.write_.shared_alloc_.direct_ptr);
    Read<double>::Read(&local_138,(Read<double> *)local_c0);
    Read<int>::Read(&local_148,(Read<int> *)local_e0);
    Read<int>::Read((Read<int> *)local_158,(Read<int> *)local_108);
    get_hinge_angles((Omega_h *)local_128,mesh,&local_138,&local_148,(LOs *)local_158);
    Read<int>::~Read((Read<int> *)local_158);
    Read<int>::~Read(&local_148);
    Read<double>::~Read(&local_138);
    size_in = Mesh::nents(mesh,side_is_exposed.write_.shared_alloc_.direct_ptr._4_4_ + -2);
    hinge_is_sharp.shared_alloc_.direct_ptr._4_4_ = size_in;
    std::allocator<char>::allocator();
    std::__cxx11::string::string(local_190,"",(allocator *)((long)&f.sharp_angle + 7));
    Write<signed_char>::Write((Write<signed_char> *)local_170,size_in,'\0',(string *)local_190);
    std::__cxx11::string::~string(local_190);
    std::allocator<char>::~allocator((allocator<char> *)((long)&f.sharp_angle + 7));
    Read<int>::Read((Read<int> *)local_1d0,(Read<int> *)local_e0);
    Write<signed_char>::Write
              ((Write<signed_char> *)&f.surf_hinge2hinge.write_.shared_alloc_.direct_ptr,
               (Write<signed_char> *)local_170);
    Read<double>::Read((Read<double> *)&f.hinge_is_sharp.shared_alloc_.direct_ptr,
                       (Read<double> *)local_128);
    f.surf_hinge_angles.write_.shared_alloc_.direct_ptr = (void *)sharp_angle;
    parallel_for<Omega_h::classify_by_angles(Omega_h::Mesh*,double)::__0>
              (side2surf_side.write_.shared_alloc_.direct_ptr._4_4_,(type *)local_1d0,
               "classify_by_angles(is_sharp)");
    Read<signed_char>::Read(&local_1e0,(Read<signed_char> *)local_80);
    Write<signed_char>::Write(&local_200,(Write<signed_char> *)local_170);
    Read<signed_char>::Read(&local_1f0,&local_200);
    classify_hinges_by_sharpness(mesh,&local_1e0,&local_1f0);
    Read<signed_char>::~Read(&local_1f0);
    Write<signed_char>::~Write(&local_200);
    Read<signed_char>::~Read(&local_1e0);
    bVar2 = side_is_exposed.write_.shared_alloc_.direct_ptr._4_4_ != 2;
    if (bVar2) {
      finalize_classification(mesh);
    }
    hinge_is_exposed.write_.shared_alloc_.direct_ptr._1_3_ = 0;
    hinge_is_exposed.write_.shared_alloc_.direct_ptr._0_1_ = !bVar2;
    classify_by_angles(Omega_h::Mesh*,double)::$_0::~__0((__0 *)local_1d0);
    Write<signed_char>::~Write((Write<signed_char> *)local_170);
    Read<double>::~Read((Read<double> *)local_128);
    Read<int>::~Read((Read<int> *)local_108);
    Read<int>::~Read((Read<int> *)local_e0);
    Read<double>::~Read((Read<double> *)local_c0);
    Read<int>::~Read((Read<int> *)local_a0);
    Read<signed_char>::~Read((Read<signed_char> *)local_80);
  }
  Read<signed_char>::~Read((Read<signed_char> *)local_50);
  return;
}

Assistant:

void classify_by_angles(Mesh* mesh, Real sharp_angle) {
  OMEGA_H_CHECK(mesh->family() == OMEGA_H_SIMPLEX);
  auto dim = mesh->dim();
  classify_elements(mesh);
  auto side_is_exposed = mark_exposed_sides(mesh);
  classify_sides_by_exposure(mesh, side_is_exposed);
  if (dim == 1) return;
  auto hinge_is_exposed = mark_down(mesh, dim - 1, dim - 2, side_is_exposed);
  auto surf_side2side = collect_marked(side_is_exposed);
  auto surf_side_normals = get_side_vectors(mesh, surf_side2side);
  auto surf_hinge2hinge = collect_marked(hinge_is_exposed);
  auto nsurf_hinges = surf_hinge2hinge.size();
  auto nsides = mesh->nents(dim - 1);
  auto side2surf_side = invert_injective_map(surf_side2side, nsides);
  auto surf_hinge_angles = get_hinge_angles(
      mesh, surf_side_normals, surf_hinge2hinge, side2surf_side);
  auto nhinges = mesh->nents(dim - 2);
  Write<I8> hinge_is_sharp(nhinges, 0);
  auto f = OMEGA_H_LAMBDA(LO surf_hinge) {
    LO hinge = surf_hinge2hinge[surf_hinge];
    hinge_is_sharp[hinge] = (surf_hinge_angles[surf_hinge] >= sharp_angle);
  };
  parallel_for(nsurf_hinges, f, "classify_by_angles(is_sharp)");
  classify_hinges_by_sharpness(mesh, hinge_is_exposed, hinge_is_sharp);
  if (dim == 2) return;
  finalize_classification(mesh);
}